

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O2

int x509v3_cache_extensions(X509 *x)

{
  CRYPTO_MUTEX *lock;
  byte bVar1;
  ASN1_INTEGER *a;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 in_RAX;
  EVP_MD *type;
  long lVar6;
  BASIC_CONSTRAINTS *a_00;
  ASN1_BIT_STRING *a_01;
  OPENSSL_STACK *pOVar7;
  size_t sVar8;
  ASN1_OBJECT *o;
  ASN1_OCTET_STRING *pAVar9;
  AUTHORITY_KEYID *pAVar10;
  X509_NAME *pXVar11;
  X509_NAME *b;
  stack_st_GENERAL_NAME *psVar12;
  NAME_CONSTRAINTS *pNVar13;
  X509_EXTENSION *ex;
  undefined8 *puVar14;
  int *piVar15;
  ulong uVar16;
  size_t i_1;
  ulong i_00;
  size_t i;
  undefined8 local_38;
  
  lock = &x->lock;
  local_38 = in_RAX;
  CRYPTO_MUTEX_lock_read(lock);
  uVar5 = x->ex_flags;
  CRYPTO_MUTEX_unlock_read(lock);
  if ((uVar5 >> 8 & 1) != 0) goto LAB_0019baf8;
  CRYPTO_MUTEX_lock_write(lock);
  if ((x->ex_flags & 0x100) == 0) {
    type = EVP_sha256();
    iVar3 = X509_digest((X509 *)x,type,x->cert_hash,(uint *)0x0);
    if (iVar3 == 0) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    lVar6 = X509_get_version(x);
    if (lVar6 == 0) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x40;
    }
    a_00 = (BASIC_CONSTRAINTS *)X509_get_ext_d2i((X509 *)x,0x57,(int *)&local_38,(int *)0x0);
    if (a_00 == (BASIC_CONSTRAINTS *)0x0) {
      uVar5 = 0x80;
      if ((int)local_38 != -1) goto LAB_0019b7fa;
    }
    else {
      iVar3 = a_00->ca;
      if (iVar3 != 0) {
        *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x10;
      }
      a = a_00->pathlen;
      if (a == (ASN1_INTEGER *)0x0) {
        lVar6 = -1;
      }
      else if ((iVar3 == 0) || (a->type == 0x102)) {
        *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
        lVar6 = 0;
      }
      else {
        lVar6 = ASN1_INTEGER_get(a);
      }
      uVar5 = 1;
      x->ex_pathlen = lVar6;
      BASIC_CONSTRAINTS_free(a_00);
LAB_0019b7fa:
      x->ex_flags = x->ex_flags | uVar5;
    }
    a_01 = (ASN1_BIT_STRING *)X509_get_ext_d2i((X509 *)x,0x53,(int *)&local_38,(int *)0x0);
    if (a_01 == (ASN1_BIT_STRING *)0x0) {
      if ((int)local_38 != -1) {
        *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
      }
    }
    else {
      iVar3 = a_01->length;
      if (iVar3 < 1) {
        x->ex_kusage = 0;
      }
      else {
        pbVar2 = a_01->data;
        bVar1 = *pbVar2;
        x->ex_kusage = (uint)bVar1;
        if (iVar3 != 1) {
          x->ex_kusage = (uint)CONCAT11(pbVar2[1],bVar1);
        }
      }
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 2;
      ASN1_BIT_STRING_free(a_01);
    }
    x->ex_xkusage = 0;
    pOVar7 = (OPENSSL_STACK *)X509_get_ext_d2i((X509 *)x,0x7e,(int *)&local_38,(int *)0x0);
    if (pOVar7 == (OPENSSL_STACK *)0x0) {
      if ((int)local_38 != -1) {
        *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
      }
    }
    else {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 4;
      for (uVar16 = 0; sVar8 = OPENSSL_sk_num(pOVar7), uVar16 < sVar8; uVar16 = uVar16 + 1) {
        o = (ASN1_OBJECT *)OPENSSL_sk_value(pOVar7,uVar16);
        iVar3 = OBJ_obj2nid(o);
        uVar5 = 1;
        switch(iVar3) {
        case 0x81:
          break;
        case 0x82:
          uVar5 = 2;
          break;
        case 0x83:
          uVar5 = 8;
          break;
        case 0x84:
          uVar5 = 4;
          break;
        case 0x85:
          uVar5 = 0x40;
          break;
        case 0x86:
        case 0x87:
        case 0x88:
        case 0x8a:
          goto switchD_0019b8b7_caseD_86;
        case 0x89:
        case 0x8b:
          uVar5 = 0x10;
          break;
        default:
          if (iVar3 == 0xb4) {
            uVar5 = 0x20;
          }
          else if (iVar3 == 0x129) {
            uVar5 = 0x80;
          }
          else {
            if (iVar3 != 0x38e) goto switchD_0019b8b7_caseD_86;
            uVar5 = 0x100;
          }
        }
        x->ex_xkusage = x->ex_xkusage | uVar5;
switchD_0019b8b7_caseD_86:
      }
      sk_ASN1_OBJECT_pop_free((stack_st_ASN1_OBJECT *)pOVar7,ASN1_OBJECT_free);
    }
    pAVar9 = (ASN1_OCTET_STRING *)X509_get_ext_d2i((X509 *)x,0x52,(int *)&local_38,(int *)0x0);
    x->skid = pAVar9;
    if ((pAVar9 == (ASN1_OCTET_STRING *)0x0) && ((int)local_38 != -1)) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    pAVar10 = (AUTHORITY_KEYID *)X509_get_ext_d2i((X509 *)x,0x5a,(int *)&local_38,(int *)0x0);
    x->akid = pAVar10;
    if ((pAVar10 == (AUTHORITY_KEYID *)0x0) && ((int)local_38 != -1)) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    pXVar11 = X509_get_subject_name((X509 *)x);
    b = X509_get_issuer_name((X509 *)x);
    iVar3 = X509_NAME_cmp(pXVar11,b);
    if (iVar3 == 0) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x20;
      iVar3 = X509_check_akid((X509 *)x,(AUTHORITY_KEYID *)x->akid);
      if ((iVar3 == 0) && (((x->ex_flags & 2) == 0 || ((x->ex_kusage & 4) != 0)))) {
        x->ex_flags = x->ex_flags | 0x2000;
      }
    }
    psVar12 = (stack_st_GENERAL_NAME *)X509_get_ext_d2i((X509 *)x,0x55,(int *)&local_38,(int *)0x0);
    x->altname = psVar12;
    if ((psVar12 == (stack_st_GENERAL_NAME *)0x0) && ((int)local_38 != -1)) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    pNVar13 = (NAME_CONSTRAINTS *)X509_get_ext_d2i((X509 *)x,0x29a,(int *)&local_38,(int *)0x0);
    x->nc = pNVar13;
    if ((pNVar13 == (NAME_CONSTRAINTS *)0x0) && ((int)local_38 != -1)) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    pOVar7 = (OPENSSL_STACK *)
             X509_get_ext_d2i((X509 *)x,0x67,(int *)((long)&local_38 + 4),(int *)0x0);
    x->crldp = (stack_st_DIST_POINT *)pOVar7;
    if ((pOVar7 == (OPENSSL_STACK *)0x0) && (local_38._4_4_ != -1)) {
LAB_0019ba14:
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    else {
      for (uVar16 = 0; sVar8 = OPENSSL_sk_num(pOVar7), uVar16 < sVar8; uVar16 = uVar16 + 1) {
        puVar14 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)x->crldp,uVar16);
        if (((int *)*puVar14 != (int *)0x0) && (*(int *)*puVar14 == 1)) {
          i_00 = 0;
          do {
            sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)puVar14[2]);
            if (sVar8 <= i_00) goto LAB_0019babb;
            piVar15 = (int *)OPENSSL_sk_value((OPENSSL_STACK *)puVar14[2],i_00);
            i_00 = i_00 + 1;
          } while (*piVar15 != 4);
          pXVar11 = *(X509_NAME **)(piVar15 + 2);
          if (pXVar11 == (X509_NAME *)0x0) {
LAB_0019babb:
            pXVar11 = X509_get_issuer_name((X509 *)x);
          }
          iVar3 = DIST_POINT_set_dpname((DIST_POINT_NAME *)*puVar14,pXVar11);
          if (iVar3 == 0) goto LAB_0019ba14;
        }
        pOVar7 = (OPENSSL_STACK *)x->crldp;
      }
    }
    iVar3 = 0;
    while( true ) {
      local_38 = CONCAT44(local_38._4_4_,iVar3);
      iVar4 = X509_get_ext_count((X509 *)x);
      if (iVar4 <= iVar3) break;
      ex = X509_get_ext((X509 *)x,(int)local_38);
      iVar3 = X509_EXTENSION_get_critical(ex);
      if ((iVar3 != 0) && (iVar3 = X509_supported_extension(ex), iVar3 == 0)) {
        uVar5 = x->ex_flags | 0x200;
        goto LAB_0019bae8;
      }
      iVar3 = (int)local_38 + 1;
    }
    uVar5 = x->ex_flags;
LAB_0019bae8:
    x->ex_flags = uVar5 | 0x100;
  }
  CRYPTO_MUTEX_unlock_write(lock);
LAB_0019baf8:
  return (int)(-1 < (char)x->ex_flags);
}

Assistant:

int x509v3_cache_extensions(X509 *x) {
  BASIC_CONSTRAINTS *bs;
  ASN1_BIT_STRING *usage;
  EXTENDED_KEY_USAGE *extusage;
  size_t i;
  int j;

  CRYPTO_MUTEX_lock_read(&x->lock);
  const int is_set = x->ex_flags & EXFLAG_SET;
  CRYPTO_MUTEX_unlock_read(&x->lock);

  if (is_set) {
    return (x->ex_flags & EXFLAG_INVALID) == 0;
  }

  CRYPTO_MUTEX_lock_write(&x->lock);
  if (x->ex_flags & EXFLAG_SET) {
    CRYPTO_MUTEX_unlock_write(&x->lock);
    return (x->ex_flags & EXFLAG_INVALID) == 0;
  }

  if (!X509_digest(x, EVP_sha256(), x->cert_hash, NULL)) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  // V1 should mean no extensions ...
  if (X509_get_version(x) == X509_VERSION_1) {
    x->ex_flags |= EXFLAG_V1;
  }
  // Handle basic constraints
  if ((bs = reinterpret_cast<BASIC_CONSTRAINTS *>(
           X509_get_ext_d2i(x, NID_basic_constraints, &j, NULL)))) {
    if (bs->ca) {
      x->ex_flags |= EXFLAG_CA;
    }
    if (bs->pathlen) {
      if ((bs->pathlen->type == V_ASN1_NEG_INTEGER) || !bs->ca) {
        x->ex_flags |= EXFLAG_INVALID;
        x->ex_pathlen = 0;
      } else {
        // TODO(davidben): |ASN1_INTEGER_get| returns -1 on overflow,
        // which currently acts as if the constraint isn't present. This
        // works (an overflowing path length constraint may as well be
        // infinity), but Chromium's verifier simply treats values above
        // 255 as an error.
        x->ex_pathlen = ASN1_INTEGER_get(bs->pathlen);
      }
    } else {
      x->ex_pathlen = -1;
    }
    BASIC_CONSTRAINTS_free(bs);
    x->ex_flags |= EXFLAG_BCONS;
  } else if (j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  // Handle key usage
  if ((usage = reinterpret_cast<ASN1_BIT_STRING *>(
           X509_get_ext_d2i(x, NID_key_usage, &j, NULL)))) {
    if (usage->length > 0) {
      x->ex_kusage = usage->data[0];
      if (usage->length > 1) {
        x->ex_kusage |= usage->data[1] << 8;
      }
    } else {
      x->ex_kusage = 0;
    }
    x->ex_flags |= EXFLAG_KUSAGE;
    ASN1_BIT_STRING_free(usage);
  } else if (j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  x->ex_xkusage = 0;
  if ((extusage = reinterpret_cast<EXTENDED_KEY_USAGE *>(
           X509_get_ext_d2i(x, NID_ext_key_usage, &j, NULL)))) {
    x->ex_flags |= EXFLAG_XKUSAGE;
    for (i = 0; i < sk_ASN1_OBJECT_num(extusage); i++) {
      switch (OBJ_obj2nid(sk_ASN1_OBJECT_value(extusage, i))) {
        case NID_server_auth:
          x->ex_xkusage |= XKU_SSL_SERVER;
          break;

        case NID_client_auth:
          x->ex_xkusage |= XKU_SSL_CLIENT;
          break;

        case NID_email_protect:
          x->ex_xkusage |= XKU_SMIME;
          break;

        case NID_code_sign:
          x->ex_xkusage |= XKU_CODE_SIGN;
          break;

        case NID_ms_sgc:
        case NID_ns_sgc:
          x->ex_xkusage |= XKU_SGC;
          break;

        case NID_OCSP_sign:
          x->ex_xkusage |= XKU_OCSP_SIGN;
          break;

        case NID_time_stamp:
          x->ex_xkusage |= XKU_TIMESTAMP;
          break;

        case NID_dvcs:
          x->ex_xkusage |= XKU_DVCS;
          break;

        case NID_anyExtendedKeyUsage:
          x->ex_xkusage |= XKU_ANYEKU;
          break;
      }
    }
    sk_ASN1_OBJECT_pop_free(extusage, ASN1_OBJECT_free);
  } else if (j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }

  x->skid = reinterpret_cast<ASN1_OCTET_STRING *>(
      X509_get_ext_d2i(x, NID_subject_key_identifier, &j, NULL));
  if (x->skid == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  x->akid = reinterpret_cast<AUTHORITY_KEYID *>(
      X509_get_ext_d2i(x, NID_authority_key_identifier, &j, NULL));
  if (x->akid == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  // Does subject name match issuer ?
  if (!X509_NAME_cmp(X509_get_subject_name(x), X509_get_issuer_name(x))) {
    x->ex_flags |= EXFLAG_SI;
    // If SKID matches AKID also indicate self signed
    if (X509_check_akid(x, x->akid) == X509_V_OK &&
        !ku_reject(x, X509v3_KU_KEY_CERT_SIGN)) {
      x->ex_flags |= EXFLAG_SS;
    }
  }
  x->altname = reinterpret_cast<STACK_OF(GENERAL_NAME) *>(
      X509_get_ext_d2i(x, NID_subject_alt_name, &j, NULL));
  if (x->altname == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  x->nc = reinterpret_cast<NAME_CONSTRAINTS *>(
      X509_get_ext_d2i(x, NID_name_constraints, &j, NULL));
  if (x->nc == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  if (!setup_crldp(x)) {
    x->ex_flags |= EXFLAG_INVALID;
  }

  for (j = 0; j < X509_get_ext_count(x); j++) {
    const X509_EXTENSION *ex = X509_get_ext(x, j);
    if (!X509_EXTENSION_get_critical(ex)) {
      continue;
    }
    if (!X509_supported_extension(ex)) {
      x->ex_flags |= EXFLAG_CRITICAL;
      break;
    }
  }
  x->ex_flags |= EXFLAG_SET;

  CRYPTO_MUTEX_unlock_write(&x->lock);
  return (x->ex_flags & EXFLAG_INVALID) == 0;
}